

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O3

void __thiscall Dersig100Setup::Dersig100Setup(Dersig100Setup *this)

{
  TestOpts opts;
  long in_FS_OFFSET;
  initializer_list<const_char_*> __l;
  undefined8 in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = "-testactivationheight=dersig@102";
  __l._M_len = 1;
  __l._M_array = &local_20;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffc0,__l,
             (allocator_type *)&stack0xffffffffffffffbf);
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = in_stack_ffffffffffffffc0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffffb8;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffc8;
  opts._24_8_ = in_stack_ffffffffffffffd0;
  TestChain100Setup::TestChain100Setup(&this->super_TestChain100Setup,REGTEST,opts);
  if (in_stack_ffffffffffffffc0 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffffc0,
                    (long)in_stack_ffffffffffffffd0 - (long)in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Dersig100Setup()
        : TestChain100Setup{ChainType::REGTEST, {.extra_args = {"-testactivationheight=dersig@102"}}} {}